

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O0

void Wlc_WriteTables(FILE *pFile,Wlc_Ntk_t *p)

{
  int iVar1;
  int nOuts;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar2;
  word *pTable_00;
  Wlc_Obj_t *p_01;
  int local_3c;
  int i;
  word *pTable;
  Wlc_Obj_t *pFanin;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Wlc_Ntk_t *p_local;
  FILE *pFile_local;
  
  if ((p->vTables != (Vec_Ptr_t *)0x0) && (iVar1 = Vec_PtrSize(p->vTables), iVar1 != 0)) {
    iVar1 = Vec_PtrSize(p->vTables);
    p_00 = Vec_IntStart(iVar1);
    for (local_3c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pWVar2 = Wlc_NtkObj(p,local_3c);
      if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x35) {
        iVar1 = Wlc_ObjTableId(pWVar2);
        Vec_IntWriteEntry(p_00,iVar1,local_3c);
      }
    }
    for (local_3c = 0; iVar1 = Vec_PtrSize(p->vTables), local_3c < iVar1; local_3c = local_3c + 1) {
      pTable_00 = (word *)Vec_PtrEntry(p->vTables,local_3c);
      iVar1 = Vec_IntEntry(p_00,local_3c);
      pWVar2 = Wlc_NtkObj(p,iVar1);
      if ((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x35) {
        __assert_fail("pObj->Type == WLC_OBJ_TABLE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcWriteVer.c"
                      ,0x51,"void Wlc_WriteTables(FILE *, Wlc_Ntk_t *)");
      }
      p_01 = Wlc_ObjFanin0(p,pWVar2);
      iVar1 = Wlc_ObjRange(p_01);
      nOuts = Wlc_ObjRange(pWVar2);
      Wlc_WriteTableOne(pFile,iVar1,nOuts,pTable_00,local_3c);
    }
    Vec_IntFree(p_00);
  }
  return;
}

Assistant:

void Wlc_WriteTables( FILE * pFile, Wlc_Ntk_t * p )
{
    Vec_Int_t * vNodes;
    Wlc_Obj_t * pObj, * pFanin;
    word * pTable;
    int i;
    if ( p->vTables == NULL || Vec_PtrSize(p->vTables) == 0 )
        return;
    // map tables into their nodes
    vNodes = Vec_IntStart( Vec_PtrSize(p->vTables) );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type == WLC_OBJ_TABLE )
            Vec_IntWriteEntry( vNodes, Wlc_ObjTableId(pObj), i );
    // write tables
    Vec_PtrForEachEntry( word *, p->vTables, pTable, i )
    {
        pObj = Wlc_NtkObj( p, Vec_IntEntry(vNodes, i) );
        assert( pObj->Type == WLC_OBJ_TABLE );
        pFanin = Wlc_ObjFanin0( p, pObj );
        Wlc_WriteTableOne( pFile, Wlc_ObjRange(pFanin), Wlc_ObjRange(pObj), pTable, i );
    }
    Vec_IntFree( vNodes );
}